

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void __thiscall vkt::api::anon_unknown_1::Sampler::Parameters::Parameters(Parameters *this)

{
  Parameters *this_local;
  
  this->magFilter = VK_FILTER_NEAREST;
  this->minFilter = VK_FILTER_NEAREST;
  this->mipmapMode = VK_SAMPLER_MIPMAP_MODE_NEAREST;
  this->addressModeU = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
  this->addressModeV = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
  this->addressModeW = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
  this->mipLodBias = 0.0;
  this->anisotropyEnable = 0;
  this->maxAnisotropy = 1.0;
  this->compareEnable = 0;
  this->compareOp = VK_COMPARE_OP_ALWAYS;
  this->minLod = -1000.0;
  this->maxLod = 1000.0;
  this->borderColor = VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
  this->unnormalizedCoordinates = 0;
  return;
}

Assistant:

Parameters (void)
			: magFilter					(VK_FILTER_NEAREST)
			, minFilter					(VK_FILTER_NEAREST)
			, mipmapMode				(VK_SAMPLER_MIPMAP_MODE_NEAREST)
			, addressModeU				(VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE)
			, addressModeV				(VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE)
			, addressModeW				(VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE)
			, mipLodBias				(0.0f)
			, anisotropyEnable			(VK_FALSE)
			, maxAnisotropy				(1.0f)
			, compareEnable				(VK_FALSE)
			, compareOp					(VK_COMPARE_OP_ALWAYS)
			, minLod					(-1000.f)
			, maxLod					(+1000.f)
			, borderColor				(VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK)
			, unnormalizedCoordinates	(VK_FALSE)
		{}